

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_out_in_init_high(APITests *this)

{
  int iVar1;
  string local_80;
  string local_60;
  string local_40;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  iVar1 = GPIO::input((this->pin_data).in_a);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  assert::is_true(iVar1 == 1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  GPIO::output((this->pin_data).out_a,0);
  iVar1 = GPIO::input((this->pin_data).in_a);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  assert::is_true(iVar1 == 0,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  GPIO::output((this->pin_data).out_a,1);
  iVar1 = GPIO::input((this->pin_data).in_a);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  assert::is_true(iVar1 == 1,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  GPIO::cleanup();
  return;
}

Assistant:

void test_out_in_init_high()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        auto val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::output(pin_data.out_a, GPIO::LOW);
        val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::LOW);

        GPIO::output(pin_data.out_a, GPIO::HIGH);
        val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::cleanup();
    }